

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::PrintStatementSourceLineFromStartOffset(FunctionBody *this,uint cchStartOffset)

{
  Utf8SourceInfo *this_00;
  code *pcVar1;
  bool bVar2;
  WORD WVar3;
  LPCUTF8 pch;
  undefined4 *puVar4;
  LPCUTF8 puVar5;
  undefined6 extraout_var;
  size_t sVar6;
  size_t sVar7;
  Memory *this_01;
  char16_t *pcVar8;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  undefined1 local_70 [8];
  TrackAllocData data;
  ULONG local_3c;
  int local_38;
  ULONG line;
  LONG col;
  
  pch = ParseableFunctionInfo::GetStartOfDocument
                  (&this->super_ParseableFunctionInfo,
                   L"FunctionBody::PrintStatementSourceLineFromStartOffset");
  this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  if (this_00 == (Utf8SourceInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x120a,"(sourceInfo != nullptr)","sourceInfo != nullptr");
    if (!bVar2) goto LAB_006cbf00;
    *puVar4 = 0;
  }
  puVar5 = Utf8SourceInfo::GetSource
                     (this_00,L"FunctionBody::PrintStatementSourceLineFromStartOffset");
  if (puVar5 == (LPCUTF8)0x0) {
    if ((this_00->field_0xa8 & 4) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x120e,"(sourceInfo->GetIsLibraryCode())",
                                  "sourceInfo->GetIsLibraryCode()");
      if (!bVar2) goto LAB_006cbf00;
      *puVar4 = 0;
    }
  }
  else {
    if (pch != puVar5) {
      Output::Print(L"\nDETECTED MISMATCH:\n");
      Output::Print(L"GetUtf8SourceInfo()->GetSource(): 0x%08X: %.*s ...\n",this_00,0x10,this_00);
      Output::Print(L"GetStartOfDocument():             0x%08X: %.*s ...\n",pch,0x10,pch);
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x1217,"(false)","Non-matching start of document");
      if (!bVar2) goto LAB_006cbf00;
      *puVar4 = 0;
    }
    GetLineCharOffsetFromStartChar(this,cchStartOffset,&local_3c,&local_38,false);
    if ((this_00->sourceHolder).ptr != (ISourceHolder *)ISourceHolder::emptySourceHolder) {
      if (DAT_014361b9 == '\x01') {
        WVar3 = Output::SetConsoleForeground(0xc);
        line = (ULONG)CONCAT62(extraout_var,WVar3);
      }
      else {
        line = 0;
      }
      Output::Print(L"\n\n  Line %3d: ");
      sVar6 = Utf8SourceInfo::GetCbLength(this_00,(char16 *)0x0);
      sVar7 = utf8::CharacterIndexToByteIndex
                        (pch,sVar6,cchStartOffset,
                         (ulong)(this->super_ParseableFunctionInfo).m_cbStartOffset,
                         (this->super_ParseableFunctionInfo).m_cchStartOffset,doDefault);
      uVar9 = (ulong)((this->super_ParseableFunctionInfo).m_cbLength +
                     (this->super_ParseableFunctionInfo).m_cbStartOffset);
      uVar10 = uVar9 - sVar7;
      sVar6 = uVar10 + 2;
      local_70 = (undefined1  [8])&char16_t::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_29f156b;
      data.filename._0_4_ = 0x1227;
      data.plusSize = sVar6;
      this_01 = (Memory *)
                Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_70);
      data._32_8_ = sVar6;
      pcVar8 = Memory::AllocateArray<Memory::HeapAllocator,char16_t,false>
                         (this_01,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,sVar6);
      sVar6 = utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                        (pcVar8,pch + sVar7,pch + uVar9,doDefault,(bool *)0x0);
      if (uVar10 < sVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x1229,"(utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx)",
                                    "utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx");
        if (!bVar2) {
LAB_006cbf00:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      for (sVar7 = 0; sVar6 != sVar7; sVar7 = sVar7 + 1) {
        if ((pcVar8[sVar7] == L'\r') || (pcVar8[sVar7] == L'\n')) break;
        Output::Print(L"%lc");
      }
      Memory::DeleteArray<Memory::HeapAllocator,char16_t>
                (&Memory::HeapAllocator::Instance,data._32_8_,pcVar8);
      Output::Print(L"\n");
      pcVar8 = L"";
      if ((int)(local_38 + 1U) < 10000) {
        pcVar8 = L" ";
      }
      Output::Print(L"  Col %4d:%s^\n",(ulong)(local_38 + 1U),pcVar8);
      if ((WORD)line != 0) {
        Output::SetConsoleForeground((WORD)line);
      }
    }
  }
  return;
}

Assistant:

void FunctionBody::PrintStatementSourceLineFromStartOffset(uint cchStartOffset)
    {
        ULONG line;
        LONG col;

        LPCUTF8 source = GetStartOfDocument(_u("FunctionBody::PrintStatementSourceLineFromStartOffset"));
        Utf8SourceInfo* sourceInfo = this->GetUtf8SourceInfo();
        Assert(sourceInfo != nullptr);
        LPCUTF8 sourceInfoSrc = sourceInfo->GetSource(_u("FunctionBody::PrintStatementSourceLineFromStartOffset"));
        if(!sourceInfoSrc)
        {
            Assert(sourceInfo->GetIsLibraryCode());
            return;
        }
        if( source != sourceInfoSrc )
        {
            Output::Print(_u("\nDETECTED MISMATCH:\n"));
            Output::Print(_u("GetUtf8SourceInfo()->GetSource(): 0x%08X: %.*s ...\n"), sourceInfo, 16, sourceInfo);
            Output::Print(_u("GetStartOfDocument():             0x%08X: %.*s ...\n"), source, 16, source);

            AssertMsg(false, "Non-matching start of document");
        }

        GetLineCharOffsetFromStartChar(cchStartOffset, &line, &col, false /*canAllocateLineCache*/);

        if (sourceInfo->GetSourceHolder() != ISourceHolder::GetEmptySourceHolder())
        {
            WORD color = 0;
            if (Js::Configuration::Global.flags.DumpLineNoInColor)
            {
                color = Output::SetConsoleForeground(12);
            }
            Output::Print(_u("\n\n  Line %3d: "), line + 1);
            // Need to match up cchStartOffset to appropriate cbStartOffset given function's cbStartOffset and cchStartOffset
            size_t utf8SrcStartIdx = utf8::CharacterIndexToByteIndex(source, sourceInfo->GetCbLength(), cchStartOffset, this->m_cbStartOffset, this->m_cchStartOffset);
            size_t utf8SrcEndIdx = StartOffset() + LengthInBytes();
            char16* utf16Buf = HeapNewArray(char16, utf8SrcEndIdx - utf8SrcStartIdx + 2); 
            size_t utf16BufSz = utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(utf16Buf, source + utf8SrcStartIdx, source + utf8SrcEndIdx, utf8::DecodeOptions::doDefault);
            Assert(utf16BufSz <= utf8SrcEndIdx - utf8SrcStartIdx);
            for (size_t i = 0; i < utf16BufSz && utf16Buf[i] != _u('\n') && utf16Buf[i] != _u('\r'); i++)
            {
                Output::Print(_u("%lc"), utf16Buf[i]);
            }
            HeapDeleteArray(utf8SrcEndIdx - utf8SrcStartIdx + 2, utf16Buf);
            Output::Print(_u("\n"));
            Output::Print(_u("  Col %4d:%s^\n"), col + 1, ((col+1)<10000) ? _u(" ") : _u(""));

            if (color != 0)
            {
                Output::SetConsoleForeground(color);
            }
        }
    }